

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

int __thiscall jpge::jpeg_encoder::init(jpeg_encoder *this,EVP_PKEY_CTX *ctx)

{
  subsampling_t sVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar3;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  params *in_R9;
  params *comp_params_local;
  int src_channels_local;
  int height_local;
  int width_local;
  output_stream *pStream_local;
  jpeg_encoder *this_local;
  
  deinit(this);
  uVar3 = extraout_var;
  if ((((ctx != (EVP_PKEY_CTX *)0x0) && (0 < in_EDX)) && (0 < in_ECX)) &&
     (((in_R8D == 1 || (in_R8D == 3)) || (in_R8D == 4)))) {
    bVar2 = jpge::params::check(in_R9);
    uVar3 = extraout_var_00;
    if (bVar2) {
      this->m_pStream = (output_stream *)ctx;
      sVar1 = in_R9->m_subsampling;
      (this->m_params).m_quality = in_R9->m_quality;
      (this->m_params).m_subsampling = sVar1;
      bVar2 = in_R9->m_two_pass_flag;
      (this->m_params).m_no_chroma_discrim_flag = in_R9->m_no_chroma_discrim_flag;
      (this->m_params).m_two_pass_flag = bVar2;
      (this->m_params).m_use_std_tables = in_R9->m_use_std_tables;
      this_local._7_1_ = jpg_open(this,in_EDX,in_ECX,in_R8D);
      uVar3 = extraout_var_01;
      goto LAB_001915ea;
    }
  }
  this_local._7_1_ = false;
LAB_001915ea:
  return (int)CONCAT71(uVar3,this_local._7_1_);
}

Assistant:

bool jpeg_encoder::init(output_stream* pStream, int width, int height, int src_channels, const params& comp_params)
	{
		deinit();
		if (((!pStream) || (width < 1) || (height < 1)) || ((src_channels != 1) && (src_channels != 3) && (src_channels != 4)) || (!comp_params.check())) return false;
		m_pStream = pStream;
		m_params = comp_params;
		return jpg_open(width, height, src_channels);
	}